

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O3

bool __thiscall
Js::DeserializationCloner<Js::StreamReader>::TryCloneObject
          (DeserializationCloner<Js::StreamReader> *this,SrcTypeId typeId,Src src,Dst *dst,
          SCADeepCloneType *deepClone)

{
  ScriptContext *scriptContext;
  JavascriptLibrary *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint32 len;
  Engine *this_01;
  void *pvVar4;
  Var pvVar5;
  SharedArrayBuffer *pSVar6;
  undefined4 *puVar7;
  JavascriptArray *pJVar8;
  char16 *pcVar9;
  JavascriptDate *pJVar10;
  RecyclableObject *pRVar11;
  ArrayBuffer *pAVar12;
  undefined4 extraout_var;
  JavascriptSet *pJVar13;
  JavascriptMap *pJVar14;
  BOOL value;
  RegexFlags local_3c [4];
  uint uStack_38;
  DWORD flags;
  scaposition_t pos;
  
  scriptContext =
       (this->
       super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
       ).super_ScriptContextHolder.m_scriptContext;
  this_00 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  *deepClone = None;
  if (typeId == SCA_Transferable) {
    StreamReader::Read<unsigned_int>(this->m_reader,&stack0xffffffffffffffc8);
    this_01 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
              ::GetEngine(&this->
                           super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                         );
    pvVar4 = SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::
             ClaimTransferable(this_01,(ulong)uStack_38,this_00);
    *dst = pvVar4;
    if (pvVar4 != (void *)0x0) {
      return true;
    }
    ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
  }
  if (99 < (int)typeId) {
    pvVar5 = StreamReader::ReadHostObject(this->m_reader);
    *dst = pvVar5;
    *deepClone = HostObject;
    return true;
  }
  if (0x31 < (int)typeId) {
    if ((int)typeId < 0x50) {
      if (typeId - SCA_DenseArray < 2) {
        StreamReader::Read<unsigned_int>(this->m_reader,&stack0xffffffffffffffc8);
        pJVar8 = JavascriptLibrary::CreateArray(this_00,uStack_38);
        goto LAB_00f099e9;
      }
      if (typeId == SCA_ArrayBuffer) {
        StreamReader::Read<unsigned_int>(this->m_reader,&stack0xffffffffffffffc8);
        pAVar12 = JavascriptLibrary::CreateArrayBuffer(this_00,uStack_38);
        iVar3 = (*(pAVar12->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(pAVar12);
        len = (*(pAVar12->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x71])(pAVar12);
        Read(this,(BYTE *)CONCAT44(extraout_var,iVar3),len);
        *dst = pAVar12;
        goto LAB_00f09a39;
      }
      if (typeId == SCA_Uint8ClampedArray) {
        ReadTypedArray<unsigned_char,true>(this,dst);
        goto LAB_00f09a39;
      }
    }
    else {
      if (typeId == SCA_Map) {
        pJVar14 = JavascriptMap::New(scriptContext);
        *dst = pJVar14;
        *deepClone = Map;
        goto LAB_00f09a39;
      }
      if (typeId == SCA_Set) {
        pJVar13 = JavascriptSet::New(scriptContext);
        *dst = pJVar13;
        *deepClone = Set;
        goto LAB_00f09a39;
      }
      if (typeId == SCA_SharedArrayBuffer) {
        StreamReader::Read<long>(this->m_reader,(long *)&stack0xffffffffffffffc8);
        pSVar6 = JavascriptLibrary::CreateSharedArrayBuffer
                           (this_00,(SharedContents *)CONCAT44(flags,uStack_38));
        iVar3 = (*(pSVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x6d])(pSVar6);
        if ((char)iVar3 != *(char *)(CONCAT44(flags,uStack_38) + 0x18)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCADeserialization.cpp"
                                      ,0xe0,
                                      "(arrayBuffer->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly())"
                                      ,
                                      "arrayBuffer->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly()"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar7 = 0;
        }
        *dst = pSVar6;
        goto LAB_00f09a39;
      }
    }
switchD_00f0984f_caseD_9:
    if (8 < typeId - SCA_Int8Array) {
      return false;
    }
    ReadTypedArray(this,typeId,dst);
    goto LAB_00f09a39;
  }
  switch(typeId) {
  case SCA_StringValue:
    pcVar9 = ReadString(this,&stack0xffffffffffffffc8);
    pJVar10 = (JavascriptDate *)JavascriptString::NewWithBuffer(pcVar9,uStack_38,scriptContext);
    break;
  default:
    goto switchD_00f0984f_caseD_9;
  case SCA_BooleanTrueObject:
    value = 1;
    goto LAB_00f099fb;
  case SCA_BooleanFalseObject:
    value = 0;
LAB_00f099fb:
    pJVar10 = (JavascriptDate *)JavascriptLibrary::CreateBooleanObject(this_00,value);
    break;
  case SCA_DateObject:
    StreamReader::Read<double>(this->m_reader,(double *)&stack0xffffffffffffffc8);
    pJVar10 = JavascriptLibrary::CreateDate(this_00,(double)CONCAT44(flags,uStack_38));
    break;
  case SCA_NumberObject:
    StreamReader::Read<double>(this->m_reader,(double *)&stack0xffffffffffffffc8);
    pJVar10 = (JavascriptDate *)
              JavascriptLibrary::CreateNumberObjectWithCheck
                        (this_00,(double)CONCAT44(flags,uStack_38));
    break;
  case SCA_StringObject:
    pcVar9 = ReadString(this,&stack0xffffffffffffffc8);
    pJVar10 = (JavascriptDate *)JavascriptLibrary::CreateStringObject(this_00,pcVar9,uStack_38);
    break;
  case SCA_RegExpObject:
    pcVar9 = ReadString(this,&stack0xffffffffffffffc8);
    StreamReader::Read<unsigned_int>(this->m_reader,(uint *)local_3c);
    pJVar10 = (JavascriptDate *)
              JavascriptRegExp::CreateRegEx(pcVar9,uStack_38,local_3c[0],scriptContext);
    break;
  case SCA_Object:
    pJVar8 = (JavascriptArray *)JavascriptLibrary::CreateObject(this_00,false,0);
LAB_00f099e9:
    *dst = pJVar8;
    *deepClone = Object;
    goto LAB_00f09a39;
  }
  *dst = pJVar10;
LAB_00f09a39:
  bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar2) {
    pRVar11 = JavascriptProxy::AutoProxyWrapper(*dst);
    *dst = pRVar11;
  }
  return true;
}

Assistant:

bool DeserializationCloner<Reader>::TryCloneObject(SrcTypeId typeId, Src src, Dst* dst, SCADeepCloneType* deepClone)
    {
        ScriptContext* scriptContext = this->GetScriptContext();
        JavascriptLibrary* lib = scriptContext->GetLibrary();
        *deepClone = SCADeepCloneType::None;
        bool isObject = true;

        if (typeId == SCA_Transferable)
        {
            scaposition_t pos;
            m_reader->Read(&pos);

            *dst = this->GetEngine()->ClaimTransferable(pos, lib);
            if (*dst == nullptr)
            {
                this->ThrowSCADataCorrupt();
            }

            return true;
        }

        if (IsSCAHostObject(typeId))
        {
            *dst = m_reader->ReadHostObject();
            *deepClone = SCADeepCloneType::HostObject;
            return true;
        }

        switch (typeId)
        {
        case SCA_StringValue: // Clone string value as object type to resolve multiple references
            {               
                charcount_t len;
                const char16* buf = ReadString(&len);
                *dst = Js::JavascriptString::NewWithBuffer(buf, len, scriptContext);
                isObject = false;
            }
            break;

        case SCA_BooleanTrueObject:
            *dst = lib->CreateBooleanObject(TRUE);
            break;

        case SCA_BooleanFalseObject:
            *dst = lib->CreateBooleanObject(FALSE);
            break;

        case SCA_DateObject:
            {
                double dbl;
                m_reader->Read(&dbl);
                *dst = lib->CreateDate(dbl);
            }
            break;

        case SCA_NumberObject:
            {
                double dbl;
                m_reader->Read(&dbl);
                *dst = lib->CreateNumberObjectWithCheck(dbl);
            }
            break;

        case SCA_StringObject:
            {
                charcount_t len;
                const char16* buf = ReadString(&len);
                *dst = lib->CreateStringObject(buf, len);
            }
            break;

        case SCA_RegExpObject:
            {
                charcount_t len;
                const char16* buf = ReadString(&len);

                DWORD flags;
                m_reader->Read(&flags);
                *dst = JavascriptRegExp::CreateRegEx(buf, len,
                    static_cast<UnifiedRegex::RegexFlags>(flags), scriptContext);
            }
            break;

        case SCA_Object:
            {
                *dst = lib->CreateObject();
                *deepClone = SCADeepCloneType::Object;
            }
            break;

        case SCA_Map:
            {
                *dst = JavascriptMap::New(scriptContext);
                *deepClone = SCADeepCloneType::Map;
            }
            break;

        case SCA_Set:
            {
                *dst = JavascriptSet::New(scriptContext);
                *deepClone = SCADeepCloneType::Set;
            }
            break;

        case SCA_DenseArray:
        case SCA_SparseArray:
            {
                uint32 length;
                Read(&length);
                *dst = lib->CreateArray(length);
                *deepClone = SCADeepCloneType::Object;
            }
            break;

        case SCA_ArrayBuffer:
            {
                uint32 len;
                m_reader->Read(&len);
                ArrayBuffer* arrayBuffer = lib->CreateArrayBuffer(len);
                Read(arrayBuffer->GetBuffer(), arrayBuffer->GetByteLength());
                *dst = arrayBuffer;
            }
            break;

        case SCA_SharedArrayBuffer:
            {
                SharedContents * sharedContents;
                m_reader->Read((intptr_t*)&sharedContents);

                SharedArrayBuffer* arrayBuffer = lib->CreateSharedArrayBuffer(sharedContents);
                Assert(arrayBuffer->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly());
                *dst = arrayBuffer;
            }
            break;

//#ifdef ENABLE_WASM
//        case SCA_WebAssemblyModule:
//        {
//            uint32 len;
//            m_reader->Read(&len);
//            byte* buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), byte, len);
//            Read(buffer, len);
//            WebAssemblySource wasmSrc(buffer, len, true, scriptContext);
//            *dst = WebAssemblyModule::CreateModule(scriptContext, &wasmSrc);
//            break;
//        }
//        case SCA_WebAssemblyMemory:
//        {
//            uint32 initialLength = 0;
//            uint32 maximumLength = 0;
//            uint32 isShared = 0;
//            m_reader->Read(&initialLength);
//            m_reader->Read(&maximumLength);
//
//#ifdef ENABLE_WASM_THREADS
//            m_reader->Read(&isShared);
//            if (isShared)
//            {
//                SharedContents * sharedContents;
//                m_reader->Read((intptr_t*)&sharedContents);
//                *dst = WebAssemblyMemory::CreateFromSharedContents(initialLength, maximumLength, sharedContents, scriptContext);
//            }
//            else
//#endif
//            {
//                uint32 len;
//                m_reader->Read(&len);
//                WebAssemblyMemory* mem = WebAssemblyMemory::CreateForExistingBuffer(initialLength, maximumLength, len, scriptContext);
//                Read(mem->GetBuffer()->GetBuffer(), len);
//                *dst = mem;
//            }
//            break;
//        }
//#endif

        case SCA_Uint8ClampedArray:
            // If Khronos Interop is not enabled, we don't have Uint8ClampedArray available.
            // This is a scenario where the source buffer was created in a newer document mode 
            // but needs to be deserialized in an older document mode. 
            // What we want to do is return the buffer as a CanvasPixelArray instead of 
            // Uint8ClampedArray since the older document mode knows what CanvasPixelArray is but
            // not what Uint8ClampedArray is.
            // We don't support pixelarray in edge anymore.
            // Intentionally fall through to default (TypedArray) label

        default:
            if (IsSCATypedArray(typeId) || typeId == SCA_DataView)
            {
                ReadTypedArray(typeId, dst);
                break;
            }
            return false; // Not a supported object type
        }

#ifdef ENABLE_JS_ETW
        if (EventEnabledJSCRIPT_RECYCLER_ALLOCATE_OBJECT() && isObject)
        {
            EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(*dst);
        }
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            *dst = JavascriptProxy::AutoProxyWrapper(*dst);
        }
#endif
        return true;
    }